

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void shunt_map_down(tgestate_t *state)

{
  long in_RDI;
  tgestate_t *in_stack_00000010;
  
  *(char *)(in_RDI + 0x692) = *(char *)(in_RDI + 0x692) + -1;
  get_supertiles(in_stack_00000010);
  memmove((void *)(*(long *)(in_RDI + 0x790) + 0x18),*(void **)(in_RDI + 0x790),0x180);
  memmove((void *)(*(long *)(in_RDI + 0x7a0) + 0xc0),*(void **)(in_RDI + 0x7a0),0xc00);
  plot_topmost_tiles(in_stack_00000010);
  return;
}

Assistant:

void shunt_map_down(tgestate_t *state)
{
  assert(state != NULL);

  state->map_position.y--;

  get_supertiles(state);

  memmove(&state->tile_buf[24], &state->tile_buf[0], TILE_BUF_LENGTH - 24);
  // Conv: Original code uses LDDR
  memmove(&state->window_buf[24 * 8], &state->window_buf[0], WINDOW_BUF_LENGTH - 24 * 8);

  plot_topmost_tiles(state);
}